

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseGenericReply_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  element_type *peVar1;
  Ptr local_30;
  
  if ((object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
LAB_001ebc4e:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_30);
  }
  else {
    std::dynamic_pointer_cast<TgBot::ForceReply,TgBot::GenericReply>
              ((shared_ptr<TgBot::GenericReply> *)&local_30);
    peVar1 = local_30.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (peVar1 == (element_type *)0x0) {
      std::dynamic_pointer_cast<TgBot::ReplyKeyboardRemove,TgBot::GenericReply>
                ((shared_ptr<TgBot::GenericReply> *)&local_30);
      peVar1 = local_30.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_30.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (peVar1 == (element_type *)0x0) {
        std::dynamic_pointer_cast<TgBot::ReplyKeyboardMarkup,TgBot::GenericReply>
                  ((shared_ptr<TgBot::GenericReply> *)&local_30);
        peVar1 = local_30.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_30.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (peVar1 == (element_type *)0x0) {
          std::dynamic_pointer_cast<TgBot::InlineKeyboardMarkup,TgBot::GenericReply>
                    ((shared_ptr<TgBot::GenericReply> *)&local_30);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_30.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (local_30.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) goto LAB_001ebc4e;
          std::static_pointer_cast<TgBot::InlineKeyboardMarkup,TgBot::GenericReply>
                    ((shared_ptr<TgBot::GenericReply> *)&local_30);
          parseInlineKeyboardMarkup_abi_cxx11_(__return_storage_ptr__,this,(Ptr *)&local_30);
        }
        else {
          std::static_pointer_cast<TgBot::ReplyKeyboardMarkup,TgBot::GenericReply>
                    ((shared_ptr<TgBot::GenericReply> *)&local_30);
          parseReplyKeyboardMarkup_abi_cxx11_(__return_storage_ptr__,this,(Ptr *)&local_30);
        }
      }
      else {
        std::static_pointer_cast<TgBot::ReplyKeyboardRemove,TgBot::GenericReply>
                  ((shared_ptr<TgBot::GenericReply> *)&local_30);
        parseReplyKeyboardRemove_abi_cxx11_(__return_storage_ptr__,this,(Ptr *)&local_30);
      }
    }
    else {
      std::static_pointer_cast<TgBot::ForceReply,TgBot::GenericReply>
                ((shared_ptr<TgBot::GenericReply> *)&local_30);
      parseForceReply_abi_cxx11_(__return_storage_ptr__,this,&local_30);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseGenericReply(const GenericReply::Ptr& object) const {
    if (!object) {
        return "";
    }
    if (dynamic_pointer_cast<ForceReply>(object) != nullptr) {
        return parseForceReply(static_pointer_cast<ForceReply>(object));
    } else if (dynamic_pointer_cast<ReplyKeyboardRemove>(object) != nullptr) {
        return parseReplyKeyboardRemove(static_pointer_cast<ReplyKeyboardRemove>(object));
    } else if (dynamic_pointer_cast<ReplyKeyboardMarkup>(object) != nullptr){
        return parseReplyKeyboardMarkup(static_pointer_cast<ReplyKeyboardMarkup>(object));
    } else if (dynamic_pointer_cast<InlineKeyboardMarkup>(object) != nullptr){
        return parseInlineKeyboardMarkup(static_pointer_cast<InlineKeyboardMarkup>(object));
    }
    return "";
}